

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O2

void __thiscall
t_php_generator::generate_php_doc(t_php_generator *this,ostream *out,t_function *function)

{
  t_struct *ptVar1;
  t_field *ptVar2;
  t_type *type;
  t_function *ptVar3;
  int iVar4;
  ostream *poVar5;
  pointer pptVar6;
  stringstream ss;
  allocator local_253;
  allocator local_252;
  allocator local_251;
  t_php_generator *local_250;
  string local_248;
  ostream *local_228;
  t_function *local_220;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  local_250 = this;
  local_228 = out;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if ((function->super_t_doc).has_doc_ == true) {
    poVar5 = std::operator<<(&local_1a8,(string *)&(function->super_t_doc).doc_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  ptVar1 = function->arglist_;
  local_220 = function;
  for (pptVar6 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ptVar3 = local_220,
      pptVar6 !=
      (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    ptVar2 = *pptVar6;
    poVar5 = std::operator<<(&local_1a8,"@param ");
    type_to_phpdoc_abi_cxx11_(&local_248,local_250,ptVar2->type_);
    poVar5 = std::operator<<(poVar5,(string *)&local_248);
    poVar5 = std::operator<<(poVar5," $");
    std::operator<<(poVar5,(string *)&ptVar2->name_);
    std::__cxx11::string::~string((string *)&local_248);
    if ((ptVar2->super_t_doc).has_doc_ == true) {
      poVar5 = std::operator<<(&local_1a8," ");
      std::operator<<(poVar5,(string *)&(ptVar2->super_t_doc).doc_);
    }
    std::operator<<(&local_1a8,(string *)&::endl_abi_cxx11_);
  }
  type = local_220->returntype_;
  iVar4 = (*(type->super_t_doc)._vptr_t_doc[4])(type);
  if (((char)iVar4 == '\0') || ((type->super_t_doc).has_doc_ == true)) {
    poVar5 = std::operator<<(&local_1a8,"@return ");
    type_to_phpdoc_abi_cxx11_(&local_248,local_250,type);
    std::operator<<(poVar5,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    if ((type->super_t_doc).has_doc_ == true) {
      poVar5 = std::operator<<(&local_1a8," ");
      std::operator<<(poVar5,(string *)&(type->super_t_doc).doc_);
    }
    std::operator<<(&local_1a8,(string *)&::endl_abi_cxx11_);
  }
  ptVar1 = ptVar3->xceptions_;
  for (pptVar6 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    ptVar2 = *pptVar6;
    poVar5 = std::operator<<(&local_1a8,"@throws ");
    type_to_phpdoc_abi_cxx11_(&local_248,local_250,ptVar2->type_);
    std::operator<<(poVar5,(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    if ((ptVar2->super_t_doc).has_doc_ == true) {
      poVar5 = std::operator<<(&local_1a8," ");
      std::operator<<(poVar5,(string *)&(ptVar2->super_t_doc).doc_);
    }
    std::operator<<(&local_1a8,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::string((string *)&local_248,"/**\n",&local_251);
  std::__cxx11::string::string((string *)&local_1d8," * ",&local_252);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_218," */\n",&local_253);
  t_generator::generate_docstring_comment
            ((t_generator *)local_250,local_228,&local_248,&local_1d8,&local_1f8,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void t_php_generator::generate_php_doc(ostream& out, t_function* function) {
  stringstream ss;
  if (function->has_doc()) {
    ss << function->get_doc() << endl;
  }

  // generate parameter types doc
  const vector<t_field*>& args = function->get_arglist()->get_members();
  vector<t_field*>::const_iterator a_iter;
  for (a_iter = args.begin(); a_iter != args.end(); ++a_iter) {
    t_field* arg = *a_iter;
    ss << "@param " << type_to_phpdoc(arg->get_type()) << " $" << arg->get_name();
    if (arg->has_doc()) {
      ss << " " << arg->get_doc();
    }
    ss << endl;
  }

  // generate return type doc
  t_type* ret_type = function->get_returntype();
  if (!ret_type->is_void() || ret_type->has_doc()) {
    ss << "@return " << type_to_phpdoc(ret_type);
    if (ret_type->has_doc()) {
      ss << " " << ret_type->get_doc();
    }
    ss << endl;
  }

  // generate exceptions doc
  const vector<t_field*>& excs = function->get_xceptions()->get_members();
  vector<t_field*>::const_iterator e_iter;
  for (e_iter = excs.begin(); e_iter != excs.end(); ++e_iter) {
    t_field* exc = *e_iter;
    ss << "@throws " << type_to_phpdoc(exc->get_type());
    if (exc->has_doc()) {
      ss << " " << exc->get_doc();
    }
    ss << endl;
  }

  generate_docstring_comment(out, "/**\n", " * ", ss.str(), " */\n");
}